

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operands.c
# Opt level: O2

int GetArgs(char *name)

{
  char cVar1;
  char cVar2;
  ushort *puVar3;
  long lVar4;
  size_t sVar5;
  ushort **ppuVar6;
  long lVar7;
  int iVar8;
  char *pcVar9;
  bool bVar10;
  undefined8 uStack_c0;
  char currarg [128];
  
  uStack_c0 = 0x108c45;
  sVar5 = strlen(name);
  iVar8 = (int)sVar5 + 1;
  uStack_c0 = 0x108c53;
  Heap2Space(iVar8);
  uStack_c0 = 0x108c66;
  strcpy(NextFNS,name);
  NextFNS = NextFNS + iVar8;
  if (High2 < NextFNS) {
    High2 = NextFNS;
  }
  pcVar9 = Line + SrcLoc;
  iVar8 = 0;
  uStack_c0 = 0x108c9f;
  ppuVar6 = __ctype_b_loc();
  do {
    puVar3 = *ppuVar6;
    cVar1 = *pcVar9;
    if ((((puVar3[cVar1] >> 0xd & 1) != 0) || (cVar1 == '\0')) || (cVar1 == ';')) {
      return iVar8;
    }
    bVar10 = cVar1 == '<';
    lVar7 = 1;
    while( true ) {
      cVar2 = pcVar9[lVar7 + ((ulong)bVar10 - 1)];
      if ((long)cVar2 == 0) break;
      if (cVar1 == '<') {
        if (cVar2 == '>') {
          lVar4 = lVar7 + (ulong)bVar10;
          goto LAB_00108d18;
        }
      }
      else if (((cVar2 == ',') || (cVar2 == ';')) || ((puVar3[cVar2] & 0x2000) != 0)) break;
      currarg[lVar7 + -1] = cVar2;
      lVar7 = lVar7 + 1;
    }
    lVar4 = lVar7 + (ulong)bVar10 + -1;
LAB_00108d18:
    currarg[lVar7 + -1] = '\0';
    uStack_c0 = 0x108d26;
    Heap2Space((int)lVar7);
    uStack_c0 = 0x108d32;
    strcpy(NextFNS,currarg);
    NextFNS = NextFNS + lVar7;
    if (High2 < NextFNS) {
      High2 = NextFNS;
    }
    iVar8 = iVar8 + 1;
    pcVar9 = pcVar9 + lVar4 + (pcVar9[lVar4] == ',');
  } while( true );
}

Assistant:

int 
GetArgs (char *name)
/* Gets macro arguments and adds them to FNStack after adding "name".
 Returns the number of arguments added to the stack.
 Note that this might not be the full number of arguments
 provided if the stack overflowed.				*/
{
	register char *s, *t;
	int narg, instring;
	char currarg[MAXLINE]; /* Current argument */

	narg = strlen(name) + 1;
	Heap2Space(narg); /* Find space for name. */
	strcpy(NextFNS, name); /* Add name to stack. */
	NextFNS += narg; /* Bump pointer. */
	if (NextFNS > High2)
		High2 = NextFNS; /* Update the high-water mark. */

	narg = 0; /* Argument counter */

	s = Line + SrcLoc; /* Now scan Line. */
	while (!isspace(*s) && (*s != ';') && (*s != '\0')) {
		t = currarg;
		if ((instring = (*s == '<'))) /* String delimiter */
			s++;
		//TODO: Maybe introduce a newinstring = (*s == '"') and go for it?
		while (1) {
			if (*s == '\0')
				break; /* End of line */
			if (instring) {
				if (*s == '>') {
					s++;
					break; /* End of string */
				}
			} else {
				if ((*s == ',') /* End of operand */
				|| isspace(*s) /* End of all operands */
				|| (*s == ';')) /* Start of comments */
					break;
			}
			*t++ = *s++; /* Get a character. */
		}
		*t++ = '\0';
		Heap2Space(t - currarg); /* Check for space. */
		strcpy(NextFNS, currarg); /* Store argument. */
		NextFNS += t - currarg; /* Next available space */
		if (NextFNS > High2)
			High2 = NextFNS; /* High-water mark */
		narg++; /* Count arguments. */
		if (*s == ',')
			s++; /* Skip over separator. */
	}
	return (narg); /* Successful completion */
}